

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VariableDatum::VariableDatum
          (VariableDatum *this,DatumID ID,KOCTET *data,KUINT32 sizeInBits)

{
  KUINT32 sizeInBits_local;
  KOCTET *data_local;
  DatumID ID_local;
  VariableDatum *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__VariableDatum_00332018;
  std::
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ::vector(&this->m_v8DatumValue);
  this->m_ui32DatumID = ID;
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[0x10])(this,data,(ulong)sizeInBits);
  return;
}

Assistant:

VariableDatum::VariableDatum( DatumID ID, const KOCTET* data, KUINT32 sizeInBits )
{
    m_ui32DatumID = ID;

    SetDatumValue( data, sizeInBits );
}